

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O0

void __thiscall Excel::Stream::read<long>(Stream *this,long *retVal,int32_t bytes)

{
  byte bVar1;
  ByteOrder BVar2;
  ulong uVar3;
  undefined8 uVar4;
  int in_EDX;
  ulong *in_RSI;
  Exception *in_RDI;
  long c;
  int32_t i;
  wstring *what;
  undefined1 local_41 [33];
  ulong local_20;
  int local_18;
  int local_14;
  ulong *local_10;
  
  *in_RSI = 0;
  local_14 = in_EDX;
  if (in_EDX == 0) {
    local_14 = 8;
  }
  local_18 = 0;
  local_10 = in_RSI;
  while( true ) {
    if (local_14 <= local_18) {
      return;
    }
    bVar1 = (**(code **)(*(long *)in_RDI + 0x10))();
    local_20 = (ulong)bVar1;
    uVar3 = (**(code **)(*(long *)in_RDI + 0x18))();
    if ((uVar3 & 1) != 0) break;
    BVar2 = SystemByteOrder::byteOrder();
    if (BVar2 == *(ByteOrder *)&in_RDI->field_0x8) {
      *local_10 = local_20 << ((byte)(local_18 << 3) & 0x3f) | *local_10;
    }
    else {
      *local_10 = local_20 << ((((char)local_14 - (char)local_18) + -1) * '\b' & 0x3fU) | *local_10;
    }
    local_18 = local_18 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x30);
  what = (wstring *)local_41;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring
            ((wstring *)(local_41 + 1),L"Unexpected end of file.",(allocator *)what);
  Exception::Exception(in_RDI,what);
  __cxa_throw(uVar4,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void read( Type & retVal, int32_t bytes = 0 )
	{
		retVal = Type(0);
		if( bytes == 0 ) bytes = sizeof( Type );

		for( int32_t i = 0; i < bytes; ++i )
		{
			Type c = (Type)(unsigned char) getByte();

			if( eof() )
				throw Exception( L"Unexpected end of file." );

			if( SystemByteOrder::byteOrder() != m_byteOrder )
				retVal |= ( c << 8 * ( bytes - i - 1 ) );
			else
				retVal |= ( c << 8 * i );
		}
	}